

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O3

void __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>::
removeVertexFromSet(STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>
                    *this,void *ptr,int idx)

{
  long lVar1;
  long lVar2;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar3;
  int local_c;
  
  lVar1 = *(long *)((long)ptr + 0x10);
  if (lVar1 != 0) {
    lVar2 = (long)ptr + 8;
    do {
      if (idx <= *(int *)(lVar1 + 0x20)) {
        lVar2 = lVar1;
      }
      lVar1 = *(long *)(lVar1 + 0x10 + (ulong)(*(int *)(lVar1 + 0x20) < idx) * 8);
    } while (lVar1 != 0);
    if ((lVar2 != (long)ptr + 8) && (*(int *)(lVar2 + 0x20) <= idx)) {
      local_c = idx;
      pVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)ptr,&local_c);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   ptr,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
    }
  }
  return;
}

Assistant:

void STLSetImplement<Set, Base>::removeVertexFromSet(void *ptr, int idx) {
	Set *__ptr__ = (Set*) ptr;
	if (__ptr__ -> count(idx)) __ptr__ -> erase(idx);
}